

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86emithelper.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::x86::EmitHelper::emitEpilog(EmitHelper *this,FuncFrame *frame)

{
  Arch AVar1;
  BaseEmitter *this_00;
  uint32_t instId;
  RegGroup RVar2;
  RegGroup group_00;
  Error EVar3;
  uint32_t uVar4;
  uint uVar5;
  RegGroup group;
  uint32_t uVar6;
  Error unaff_EBP;
  uint uVar7;
  bool bVar8;
  BitWordIterator<unsigned_int> it;
  uint32_t xSize;
  uint32_t xInst;
  Gp zbp;
  Gp zsp;
  Mem xBase;
  Gp gpReg;
  Operand_ local_48;
  
  this_00 = (this->super_BaseEmitHelper)._emitter;
  AVar1 = (this_00->_environment)._arch;
  uVar5 = (frame->_preservedRegs)._data[0] & (frame->_dirtyRegs)._data[0];
  zbp.super_Reg.super_BaseReg.super_Operand.super_Operand_._signature._bits =
       (this_00->_gpSignature)._bits;
  zsp.super_Reg.super_BaseReg.super_Operand.super_Operand_._baseId = 4;
  zsp.super_Reg.super_BaseReg.super_Operand.super_Operand_._data[0] = 0;
  zsp.super_Reg.super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
  zbp.super_Reg.super_BaseReg.super_Operand.super_Operand_._baseId = 5;
  zbp.super_Reg.super_BaseReg.super_Operand.super_Operand_._data[0] = 0;
  zbp.super_Reg.super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
  gpReg.super_Reg.super_BaseReg.super_Operand.super_Operand_._baseId = 4;
  gpReg.super_Reg.super_BaseReg.super_Operand.super_Operand_._data[0] = 0;
  gpReg.super_Reg.super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
  uVar7 = uVar5 & 0xffffffdf;
  if ((frame->_attributes & kHasPreservedFP) == kNoAttributes) {
    uVar7 = uVar5;
  }
  xBase.super_BaseMem.super_Operand.super_Operand_._data[1] = frame->_extraRegSaveOffset;
  xBase.super_BaseMem.super_Operand.super_Operand_._signature._bits =
       zbp.super_Reg.super_BaseReg.super_Operand.super_Operand_._signature._bits & 0xf8 | 2;
  xBase.super_BaseMem.super_Operand.super_Operand_._baseId = 4;
  xBase.super_BaseMem.super_Operand.super_Operand_._data[0] = 0;
  zsp.super_Reg.super_BaseReg.super_Operand.super_Operand_._signature._bits =
       zbp.super_Reg.super_BaseReg.super_Operand.super_Operand_._signature._bits;
  gpReg.super_Reg.super_BaseReg.super_Operand.super_Operand_._signature._bits =
       zbp.super_Reg.super_BaseReg.super_Operand.super_Operand_._signature._bits;
  RVar2 = kVec;
  do {
    group_00 = RVar2;
    if (group_00 == kPC) break;
    _it = FuncFrame::savedRegs(frame,group_00);
    if (_it == 0) {
      bVar8 = true;
      EVar3 = unaff_EBP;
    }
    else {
      local_48._signature._bits = 1;
      local_48._baseId = 0xff;
      local_48._data[0] = 0;
      local_48._data[1] = 0;
      EVar3 = X86Internal_setupSaveRestoreInfo(group_00,frame,(Reg *)&local_48,&xInst,&xSize);
      instId = xInst;
      uVar6 = xSize;
      if (EVar3 == 0) {
        do {
          uVar4 = Support::BitWordIterator<unsigned_int>::next(&it);
          local_48._baseId = uVar4;
          EVar3 = BaseEmitter::_emitI(this_00,instId,&local_48,(Operand_ *)&xBase);
          bVar8 = EVar3 == 0;
          if (!bVar8) break;
          xBase.super_BaseMem.super_Operand.super_Operand_._data[1] =
               xBase.super_BaseMem.super_Operand.super_Operand_._data[1] + uVar6;
          EVar3 = unaff_EBP;
        } while (_it != 0);
      }
      else {
        bVar8 = false;
      }
    }
    unaff_EBP = EVar3;
    RVar2 = group_00 + kVec;
  } while (bVar8);
  if (group_00 != kPC) {
    return unaff_EBP;
  }
  if (((frame->_attributes & kX86_MMXCleanup) != kNoAttributes) &&
     (EVar3 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::emms
                        ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)this_00), EVar3 != 0)) {
    return EVar3;
  }
  if (((frame->_attributes & kX86_AVXCleanup) != kNoAttributes) &&
     (EVar3 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::vzeroupper
                        ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)this_00), EVar3 != 0)) {
    return EVar3;
  }
  if ((frame->_attributes & kHasPreservedFP) == kNoAttributes) {
    if ((frame->_finalStackAlignment < frame->_minDynamicAlignment) ||
       (frame->_daOffset == 0xffffffff)) {
      uVar6 = frame->_stackAdjustment;
      if (uVar6 == 0) goto LAB_00143e8a;
      xBase.super_BaseMem.super_Operand.super_Operand_._signature._bits = 4;
      xBase.super_BaseMem.super_Operand.super_Operand_._baseId = 0;
      xBase.super_BaseMem.super_Operand.super_Operand_._data[1] = (int)uVar6 >> 0x1f;
      xBase.super_BaseMem.super_Operand.super_Operand_._data[0] = uVar6;
      EVar3 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::add
                        ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)this_00,&zsp,(Imm *)&xBase
                        );
    }
    else {
      xBase.super_BaseMem.super_Operand.super_Operand_._signature._bits =
           zsp.super_Reg.super_BaseReg.super_Operand.super_Operand_._signature._bits & 0xf8 | 2;
      xBase.super_BaseMem.super_Operand.super_Operand_._baseId =
           zsp.super_Reg.super_BaseReg.super_Operand.super_Operand_._baseId;
      xBase.super_BaseMem.super_Operand.super_Operand_._data[0] = 0;
      xBase.super_BaseMem.super_Operand.super_Operand_._data[1] = frame->_daOffset;
      EVar3 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::mov
                        ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)this_00,&zsp,&xBase);
    }
  }
  else {
    uVar6 = ((uint)((AVar1 & k32BitMask) == kUnknown) * 4 + 4) - (uint)frame->_pushPopSaveSize;
    if (uVar6 == 0) {
      EVar3 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::mov
                        ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)this_00,&zsp,&zbp);
    }
    else {
      xBase.super_BaseMem.super_Operand.super_Operand_._signature._bits =
           zbp.super_Reg.super_BaseReg.super_Operand.super_Operand_._signature._bits & 0xf8 | 2;
      xBase.super_BaseMem.super_Operand.super_Operand_._baseId =
           zbp.super_Reg.super_BaseReg.super_Operand.super_Operand_._baseId;
      xBase.super_BaseMem.super_Operand.super_Operand_._data[0] = 0;
      xBase.super_BaseMem.super_Operand.super_Operand_._data[1] = uVar6;
      EVar3 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::lea
                        ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)this_00,&zsp,&xBase);
    }
  }
  if (EVar3 != 0) {
    return EVar3;
  }
LAB_00143e8a:
  if (uVar7 != 0) {
    uVar6 = 0xf;
    do {
      if ((short)uVar7 < 0) {
        gpReg.super_Reg.super_BaseReg.super_Operand.super_Operand_._baseId = uVar6;
        EVar3 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::pop
                          ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)this_00,&gpReg);
        if (EVar3 != 0) {
          return EVar3;
        }
      }
      uVar7 = uVar7 * 2;
      bVar8 = uVar6 != 0;
      uVar6 = uVar6 - 1;
    } while (bVar8);
  }
  if (((frame->_attributes & kHasPreservedFP) == kNoAttributes) ||
     (EVar3 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::pop
                        ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)this_00,&zbp), EVar3 == 0)
     ) {
    if (frame->_calleeStackCleanup == 0) {
      EVar3 = BaseEmitter::_emitI(this_00,0x2b3);
    }
    else {
      xBase.super_BaseMem.super_Operand.super_Operand_._signature._bits = 4;
      xBase.super_BaseMem.super_Operand.super_Operand_._baseId = 0;
      xBase.super_BaseMem.super_Operand.super_Operand_._data[0] =
           (uint32_t)frame->_calleeStackCleanup;
      xBase.super_BaseMem.super_Operand.super_Operand_._data[1] = 0;
      EVar3 = BaseEmitter::_emitI(this_00,0x2b3,(Operand_ *)&xBase);
    }
    if (EVar3 == 0) {
      EVar3 = 0;
    }
  }
  return EVar3;
}

Assistant:

ASMJIT_FAVOR_SIZE Error EmitHelper::emitEpilog(const FuncFrame& frame) {
  Emitter* emitter = _emitter->as<Emitter>();

  uint32_t i;
  uint32_t regId;

  uint32_t registerSize = emitter->registerSize();
  uint32_t gpSaved = frame.savedRegs(RegGroup::kGp);

  Gp zsp = emitter->zsp();   // ESP|RSP register.
  Gp zbp = emitter->zbp();   // EBP|RBP register.
  Gp gpReg = emitter->zsp(); // General purpose register (temporary).

  // Don't emit 'pop zbp' in the pop sequence, this case is handled separately.
  if (frame.hasPreservedFP())
    gpSaved &= ~Support::bitMask(Gp::kIdBp);

  // Emit 'movxxx {[x|y|z]mm, k}, [zsp + X]'.
  {
    Mem xBase = ptr(zsp, int32_t(frame.extraRegSaveOffset()));

    for (RegGroup group : Support::EnumValues<RegGroup, RegGroup(1), RegGroup::kMaxVirt>{}) {
      Support::BitWordIterator<RegMask> it(frame.savedRegs(group));
      if (it.hasNext()) {
        Reg xReg;
        uint32_t xInst;
        uint32_t xSize;
        ASMJIT_PROPAGATE(X86Internal_setupSaveRestoreInfo(group, frame, xReg, xInst, xSize));
        do {
          xReg.setId(it.next());
          ASMJIT_PROPAGATE(emitter->emit(xInst, xReg, xBase));
          xBase.addOffsetLo32(int32_t(xSize));
        } while (it.hasNext());
      }
    }
  }

  // Emit 'emms' and/or 'vzeroupper'.
  if (frame.hasMmxCleanup()) ASMJIT_PROPAGATE(emitter->emms());
  if (frame.hasAvxCleanup()) ASMJIT_PROPAGATE(emitter->vzeroupper());

  if (frame.hasPreservedFP()) {
    // Emit 'mov zsp, zbp' or 'lea zsp, [zbp - x]'
    int32_t count = int32_t(frame.pushPopSaveSize() - registerSize);
    if (!count)
      ASMJIT_PROPAGATE(emitter->mov(zsp, zbp));
    else
      ASMJIT_PROPAGATE(emitter->lea(zsp, ptr(zbp, -count)));
  }
  else {
    if (frame.hasDynamicAlignment() && frame.hasDAOffset()) {
      // Emit 'mov zsp, [zsp + DsaSlot]'.
      Mem saMem = ptr(zsp, int32_t(frame.daOffset()));
      ASMJIT_PROPAGATE(emitter->mov(zsp, saMem));
    }
    else if (frame.hasStackAdjustment()) {
      // Emit 'add zsp, StackAdjustment'.
      ASMJIT_PROPAGATE(emitter->add(zsp, int32_t(frame.stackAdjustment())));
    }
  }

  // Emit 'pop gp' sequence.
  if (gpSaved) {
    i = gpSaved;
    regId = 16;

    do {
      regId--;
      if (i & 0x8000) {
        gpReg.setId(regId);
        ASMJIT_PROPAGATE(emitter->pop(gpReg));
      }
      i <<= 1;
    } while (regId != 0);
  }

  // Emit 'pop zbp'.
  if (frame.hasPreservedFP())
    ASMJIT_PROPAGATE(emitter->pop(zbp));

  // Emit 'ret' or 'ret x'.
  if (frame.hasCalleeStackCleanup())
    ASMJIT_PROPAGATE(emitter->emit(Inst::kIdRet, int(frame.calleeStackCleanup())));
  else
    ASMJIT_PROPAGATE(emitter->emit(Inst::kIdRet));

  return kErrorOk;
}